

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void rtreedepth(sqlite3_context *ctx,int nArg,sqlite3_value **apArg)

{
  Mem *pMem;
  int iVar1;
  ushort *puVar2;
  ulong val;
  
  if (((*apArg)->flags & 0xf) == 0) {
    iVar1 = sqlite3ValueBytes(*apArg,'\x01');
    if (1 < iVar1) {
      puVar2 = (ushort *)sqlite3_value_blob(*apArg);
      val = (ulong)(ushort)(*puVar2 << 8 | *puVar2 >> 8);
      pMem = ctx->pOut;
      if ((pMem->flags & 0x2400) != 0) {
        vdbeReleaseAndSetInt64(pMem,val);
        return;
      }
      (pMem->u).i = val;
      pMem->flags = 4;
      return;
    }
  }
  ctx->isError = 1;
  sqlite3VdbeMemSetStr
            (ctx->pOut,"Invalid argument to rtreedepth()",-1,'\x01',
             (_func_void_void_ptr *)0xffffffffffffffff);
  return;
}

Assistant:

static void rtreedepth(sqlite3_context *ctx, int nArg, sqlite3_value **apArg){
  UNUSED_PARAMETER(nArg);
  if( sqlite3_value_type(apArg[0])!=SQLITE_BLOB 
   || sqlite3_value_bytes(apArg[0])<2
  ){
    sqlite3_result_error(ctx, "Invalid argument to rtreedepth()", -1); 
  }else{
    u8 *zBlob = (u8 *)sqlite3_value_blob(apArg[0]);
    sqlite3_result_int(ctx, readInt16(zBlob));
  }
}